

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.h
# Opt level: O1

void __thiscall stk::StkError::~StkError(StkError *this)

{
  pointer pcVar1;
  
  this->_vptr_StkError = (_func_int **)&PTR__StkError_00116c60;
  pcVar1 = (this->message_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->message_).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~StkError(void) {}